

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfriendlist.cc
# Opt level: O0

bool __thiscall bdFriendList::removePeer(bdFriendList *this,bdNodeId *id)

{
  bool bVar1;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_iterator<std::pair<const_bdNodeId,_bdFriendEntry>_> local_28;
  iterator it;
  bdNodeId *id_local;
  bdFriendList *this_local;
  
  it._M_node = (_Base_ptr)id;
  std::_Rb_tree_iterator<std::pair<const_bdNodeId,_bdFriendEntry>_>::_Rb_tree_iterator(&local_28);
  local_30 = (_Base_ptr)
             std::
             map<bdNodeId,_bdFriendEntry,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdFriendEntry>_>_>
             ::find(&this->mPeers,it._M_node);
  local_28._M_node = local_30;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<bdNodeId,_bdFriendEntry,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdFriendEntry>_>_>
       ::end(&this->mPeers);
  bVar1 = std::operator==(&local_28,&local_38);
  if (!bVar1) {
    std::
    map<bdNodeId,_bdFriendEntry,_std::less<bdNodeId>,_std::allocator<std::pair<const_bdNodeId,_bdFriendEntry>_>_>
    ::erase(&this->mPeers,(key_type *)it._M_node);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool bdFriendList::removePeer(const bdNodeId *id) {
	/* see if it exists... */
	std::map<bdNodeId, bdFriendEntry>::iterator it;
	it = mPeers.find(*id);
	if (it == mPeers.end()) {
#ifdef DEBUG_FRIENDLIST	
		std::cerr << "bdFriendList::removeFriend() Peer(";
		bdStdPrintNodeId(std::cerr, id);
		std::cerr << ") is unknown!";
		std::cerr << std::endl;
#endif

		return false;
	}

	mPeers.erase(*id);

	return true;
}